

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

void duckdb::StringStats::Serialize(BaseStatistics *stats,Serializer *serializer)

{
  Serializer::WriteProperty(serializer,200,"min",(const_data_ptr_t)&stats->stats_union,8);
  Serializer::WriteProperty(serializer,0xc9,"max",(stats->stats_union).string_data.max,8);
  Serializer::WriteProperty<bool>
            (serializer,0xca,"has_unicode",&(stats->stats_union).string_data.has_unicode);
  Serializer::WriteProperty<bool>
            (serializer,0xcb,"has_max_string_length",
             &(stats->stats_union).string_data.has_max_string_length);
  Serializer::WriteProperty<unsigned_int>
            (serializer,0xcc,"max_string_length",&(stats->stats_union).string_data.max_string_length
            );
  return;
}

Assistant:

void StringStats::Serialize(const BaseStatistics &stats, Serializer &serializer) {
	auto &string_data = StringStats::GetDataUnsafe(stats);
	serializer.WriteProperty(200, "min", string_data.min, StringStatsData::MAX_STRING_MINMAX_SIZE);
	serializer.WriteProperty(201, "max", string_data.max, StringStatsData::MAX_STRING_MINMAX_SIZE);
	serializer.WriteProperty(202, "has_unicode", string_data.has_unicode);
	serializer.WriteProperty(203, "has_max_string_length", string_data.has_max_string_length);
	serializer.WriteProperty(204, "max_string_length", string_data.max_string_length);
}